

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewReference(xmlDoc *doc,xmlChar *name)

{
  int len_00;
  xmlChar *pxVar1;
  xmlEntityPtr pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  int len;
  xmlEntityPtr ent;
  xmlNodePtr cur;
  xmlChar *name_local;
  xmlDoc *doc_local;
  
  if (name == (xmlChar *)0x0) {
    doc_local = (xmlDoc *)0x0;
  }
  else {
    doc_local = (xmlDoc *)(*xmlMalloc)(0x78);
    if (doc_local == (xmlDoc *)0x0) {
      doc_local = (xmlDoc *)0x0;
    }
    else {
      memset(doc_local,0,0x78);
      doc_local->type = XML_ENTITY_REF_NODE;
      doc_local->doc = doc;
      if (*name == '&') {
        pxVar1 = name + 1;
        len_00 = xmlStrlen(pxVar1);
        if (pxVar1[len_00 + -1] == ';') {
          pxVar1 = xmlStrndup(pxVar1,len_00 + -1);
          doc_local->name = (char *)pxVar1;
        }
        else {
          pxVar1 = xmlStrndup(pxVar1,len_00);
          doc_local->name = (char *)pxVar1;
        }
      }
      else {
        pxVar1 = xmlStrdup(name);
        doc_local->name = (char *)pxVar1;
      }
      if ((xmlChar *)doc_local->name == (xmlChar *)0x0) {
        xmlFreeNode((xmlNodePtr)doc_local);
        doc_local = (xmlDoc *)0x0;
      }
      else {
        pxVar2 = xmlGetDocEntity(doc,(xmlChar *)doc_local->name);
        if (pxVar2 != (xmlEntityPtr)0x0) {
          doc_local->intSubset = (_xmlDtd *)pxVar2->content;
          doc_local->children = (_xmlNode *)pxVar2;
          doc_local->last = (_xmlNode *)pxVar2;
        }
        if ((xmlRegisterCallbacks != 0) &&
           (pp_Var3 = __xmlRegisterNodeDefaultValue(), *pp_Var3 != (xmlRegisterNodeFunc)0x0)) {
          pp_Var3 = __xmlRegisterNodeDefaultValue();
          (**pp_Var3)((xmlNodePtr)doc_local);
        }
      }
    }
  }
  return (xmlNodePtr)doc_local;
}

Assistant:

xmlNodePtr
xmlNewReference(const xmlDoc *doc, const xmlChar *name) {
    xmlNodePtr cur;
    xmlEntityPtr ent;

    if (name == NULL)
        return(NULL);

    /*
     * Allocate a new node and fill the fields.
     */
    cur = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlNode));
    cur->type = XML_ENTITY_REF_NODE;

    cur->doc = (xmlDoc *)doc;
    if (name[0] == '&') {
        int len;
        name++;
	len = xmlStrlen(name);
	if (name[len - 1] == ';')
	    cur->name = xmlStrndup(name, len - 1);
	else
	    cur->name = xmlStrndup(name, len);
    } else
	cur->name = xmlStrdup(name);
    if (cur->name == NULL)
        goto error;

    ent = xmlGetDocEntity(doc, cur->name);
    if (ent != NULL) {
	cur->content = ent->content;
	/*
	 * The parent pointer in entity is a DTD pointer and thus is NOT
	 * updated.  Not sure if this is 100% correct.
	 *  -George
	 */
	cur->children = (xmlNodePtr) ent;
	cur->last = (xmlNodePtr) ent;
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue(cur);
    return(cur);

error:
    xmlFreeNode(cur);
    return(NULL);
}